

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Scaler::SerializeWithCachedSizes(Scaler *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  
  if (0 < (this->shiftvalue_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    uVar7 = this->_shiftvalue_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar5 = pbVar1;
      uVar6 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar5 = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          pbVar5 = pbVar5 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar3);
      }
      *pbVar5 = (byte)uVar6;
      iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    pRVar2 = (this->shiftvalue_).rep_;
    pdVar8 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pdVar8 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar8,(this->shiftvalue_).current_size_,output);
  }
  if ((this->scalevalue_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
    iVar4 = output->buffer_size_;
  }
  else {
    *output->buffer_ = '\x12';
    output->buffer_ = output->buffer_ + 1;
    iVar4 = output->buffer_size_ + -1;
    output->buffer_size_ = iVar4;
  }
  uVar7 = this->_scalevalue_cached_byte_size_;
  if (iVar4 < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  pRVar2 = (this->scalevalue_).rep_;
  pdVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    pdVar8 = (double *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteDoubleArray
            (pdVar8,(this->scalevalue_).current_size_,output);
  return;
}

Assistant:

void Scaler::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Scaler)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double shiftValue = 1;
  if (this->shiftvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shiftvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->shiftvalue().data(), this->shiftvalue_size(), output);
  }

  // repeated double scaleValue = 2;
  if (this->scalevalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scalevalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->scalevalue().data(), this->scalevalue_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Scaler)
}